

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::update_scrape_state(torrent *this)

{
  header_holder_type *phVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  announce_entry *t;
  node_ptr plVar5;
  uint uVar6;
  node_ptr plVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  phVar1 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
  uVar6 = 0xffffffff;
  uVar10 = 0xffffffff;
  uVar11 = 0xffffffff;
  plVar5 = &phVar1->super_node;
  while (plVar5 = ((node *)&plVar5->next_)->next_, plVar5 != &phVar1->super_node) {
    for (plVar7 = plVar5[5].next_; plVar7 != plVar5[5].prev_; plVar7 = (node_ptr)&plVar7[0xc].prev_)
    {
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        lVar9 = (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar8] * 0x48;
        uVar2 = *(uint *)((long)plVar7 + lVar9 + 0x58);
        uVar3 = *(uint *)((long)plVar7 + lVar9 + 0x5c);
        if ((int)uVar11 < (int)uVar3) {
          uVar11 = uVar3;
        }
        if ((int)uVar10 < (int)uVar2) {
          uVar10 = uVar2;
        }
        uVar2 = *(uint *)((long)plVar7 + lVar9 + 0x60);
        if ((int)uVar6 < (int)uVar2) {
          uVar6 = uVar2;
        }
      }
    }
  }
  if ((((-1 < (int)uVar11) &&
       ((*(uint *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff) != uVar11)) ||
      ((-1 < (int)uVar10 && ((*(uint *)&this->field_0x5dd & 0xffffff) != uVar10)))) ||
     ((-1 < (int)uVar6 && ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) != uVar6)))) {
    state_updated(this);
  }
  uVar4 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  uVar2 = *(uint *)&this->field_0x5dd;
  if (((((uint)uVar4 & 0xffffff) == uVar11) && ((uVar2 & 0xffffff) == uVar10)) &&
     ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) == uVar6)) {
    return;
  }
  *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
       uVar4 & 0xffffffffff000000 | (ulong)(uVar11 & 0xffffff);
  *(uint *)&this->field_0x5dd = uVar2 & 0xff000000 | uVar10 & 0xffffff;
  *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0x8000007f | (uVar6 & 0xffffff) << 7;
  update_auto_sequential(this);
  set_need_save_resume(this,(resume_data_flags_t)0x8);
  return;
}

Assistant:

void torrent::update_scrape_state()
	{
		// loop over all trackers and find the largest numbers for each scrape field
		// then update the torrent-wide understanding of number of downloaders and seeds
		int complete = -1;
		int incomplete = -1;
		int downloaded = -1;
		for (auto const& t : m_trackers)
		{
			for (auto const& aep : t.endpoints)
			{
				for (protocol_version const ih : all_versions)
				{
					auto const& a = aep.info_hashes[ih];
					complete = std::max(a.scrape_complete, complete);
					incomplete = std::max(a.scrape_incomplete, incomplete);
					downloaded = std::max(a.scrape_downloaded, downloaded);
				}
			}
		}

		if ((complete >= 0 && int(m_complete) != complete)
			|| (incomplete >= 0 && int(m_incomplete) != incomplete)
			|| (downloaded >= 0 && int(m_downloaded) != downloaded))
			state_updated();

		if (int(m_complete) != complete
			|| int(m_incomplete) != incomplete
			|| int(m_downloaded) != downloaded)
		{
			m_complete = std::uint32_t(complete);
			m_incomplete = std::uint32_t(incomplete);
			m_downloaded = std::uint32_t(downloaded);

			update_auto_sequential();

			// these numbers are cached in the resume data
			set_need_save_resume(torrent_handle::if_counters_changed);
		}
	}